

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9HashmapDup(jx9_hashmap *pSrc,jx9_hashmap *pDest)

{
  jx9_hashmap_node *pjVar1;
  jx9_vm *pjVar2;
  sxi32 in_EAX;
  sxi32 sVar3;
  jx9_value *pValue;
  jx9_hashmap_node **ppjVar4;
  uint uVar5;
  anon_union_8_3_18420de5_for_x local_78;
  undefined8 uStack_70;
  jx9_vm *local_68;
  jx9_vm *pjStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if ((pSrc != pDest) && (pSrc->nEntry != 0)) {
    ppjVar4 = &pSrc->pFirst;
    uVar5 = 0;
    do {
      pjVar1 = *ppjVar4;
      pjVar2 = pjVar1->pMap->pVm;
      if (pjVar1->nValIdx < (pjVar2->aMemObj).nUsed) {
        pValue = (jx9_value *)
                 ((ulong)(pjVar1->nValIdx * (pjVar2->aMemObj).eSize) + (long)(pjVar2->aMemObj).pBase
                 );
      }
      else {
        pValue = (jx9_value *)0x0;
      }
      if (pjVar1->iType == 2) {
        local_68 = pDest->pVm;
        local_48 = 0;
        uStack_40 = 0;
        local_78.rVal = 0.0;
        local_58 = 0;
        uStack_50 = 0;
        uStack_70 = 1;
        pjStack_60 = local_68;
        jx9MemObjStringAppend
                  ((jx9_value *)&local_78,(char *)(pjVar1->xKey).sKey.pBlob,
                   (pjVar1->xKey).sKey.nByte);
        sVar3 = HashmapInsert(pDest,(jx9_value *)&local_78,pValue);
        in_EAX = jx9MemObjRelease((jx9_value *)&local_78);
      }
      else {
        sVar3 = HashmapInsertIntKey(pDest,(pjVar1->xKey).iKey,pValue);
        in_EAX = sVar3;
      }
      if (sVar3 != 0) {
        return in_EAX;
      }
      ppjVar4 = &pjVar1->pPrev;
      uVar5 = uVar5 + 1;
    } while (uVar5 < pSrc->nEntry);
  }
  return in_EAX;
}

Assistant:

JX9_PRIVATE sxi32 jx9HashmapDup(jx9_hashmap *pSrc, jx9_hashmap *pDest)
{
	jx9_hashmap_node *pEntry;
	jx9_value sKey, *pVal;
	sxi32 rc;
	sxu32 n;
	if( pSrc == pDest ){
		/* Same map. This can easily happen since hashmaps are passed by reference.
		 * Unlike the  engine.
		 */
		return SXRET_OK;
	}
	/* Point to the first inserted entry in the source */
	pEntry = pSrc->pFirst;
	/* Perform the duplication */
	for( n = 0 ; n < pSrc->nEntry ; ++n ){
		/* Extract the node value */
		pVal = HashmapExtractNodeValue(pEntry);
		if( pEntry->iType == HASHMAP_BLOB_NODE ){
			/* Blob key insertion */
			jx9MemObjInitFromString(pDest->pVm, &sKey, 0);
			jx9MemObjStringAppend(&sKey, (const char *)SyBlobData(&pEntry->xKey.sKey), SyBlobLength(&pEntry->xKey.sKey));
			rc = jx9HashmapInsert(&(*pDest), &sKey, pVal);
			jx9MemObjRelease(&sKey);
		}else{
			/* Int key insertion */
			rc = HashmapInsertIntKey(&(*pDest), pEntry->xKey.iKey, pVal);
		}
		if( rc != SXRET_OK ){
			return rc;
		}
		/* Point to the next entry */
		pEntry = pEntry->pPrev; /* Reverse link */
	}
	return SXRET_OK;
}